

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string_view __thiscall google::protobuf::Symbol::full_name(Symbol *this)

{
  Type TVar1;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  OneofDescriptor *this_02;
  EnumDescriptor *this_03;
  EnumValueDescriptor *this_04;
  ServiceDescriptor *this_05;
  MethodDescriptor *this_06;
  FileDescriptor *this_07;
  Subpackage *pSVar2;
  LogMessage *pLVar3;
  LogMessage local_48;
  Voidify local_31;
  string_view local_30;
  Symbol *local_20;
  Symbol *this_local;
  
  local_20 = this;
  TVar1 = type(this);
  switch(TVar1) {
  case MESSAGE:
    this_00 = descriptor(this);
    _this_local = Descriptor::full_name(this_00);
    break;
  case FIELD:
    this_01 = field_descriptor(this);
    _this_local = FieldDescriptor::full_name(this_01);
    break;
  case ONEOF:
    this_02 = oneof_descriptor(this);
    _this_local = OneofDescriptor::full_name(this_02);
    break;
  case ENUM:
    this_03 = enum_descriptor(this);
    _this_local = EnumDescriptor::full_name(this_03);
    break;
  case ENUM_VALUE:
    this_04 = enum_value_descriptor(this);
    _this_local = EnumValueDescriptor::full_name(this_04);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x322,"false");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  case SERVICE:
    this_05 = service_descriptor(this);
    _this_local = ServiceDescriptor::full_name(this_05);
    break;
  case METHOD:
    this_06 = method_descriptor(this);
    _this_local = MethodDescriptor::full_name(this_06);
    break;
  case FULL_PACKAGE:
    this_07 = file_descriptor(this);
    _this_local = FileDescriptor::package(this_07);
    break;
  case SUB_PACKAGE:
    pSVar2 = sub_package_file_descriptor(this);
    local_30 = FileDescriptor::package(pSVar2->file);
    pSVar2 = sub_package_file_descriptor(this);
    _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&local_30,0,(long)pSVar2->name_size);
  }
  return _this_local;
}

Assistant:

absl::string_view full_name() const {
    switch (type()) {
      case MESSAGE:
        return descriptor()->full_name();
      case FIELD:
        return field_descriptor()->full_name();
      case ONEOF:
        return oneof_descriptor()->full_name();
      case ENUM:
        return enum_descriptor()->full_name();
      case ENUM_VALUE:
        return enum_value_descriptor()->full_name();
      case SERVICE:
        return service_descriptor()->full_name();
      case METHOD:
        return method_descriptor()->full_name();
      case FULL_PACKAGE:
        return file_descriptor()->package();
      case SUB_PACKAGE:
        return sub_package_file_descriptor()->file->package().substr(
            0, sub_package_file_descriptor()->name_size);
      default:
        ABSL_CHECK(false);
    }
    return "";
  }